

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_reflection.cc
# Opt level: O3

void __thiscall
google::protobuf::Reflection::Swap(Reflection *this,Message *message1,Message *message2)

{
  undefined4 uVar1;
  pointer pUVar2;
  pointer pUVar3;
  pointer pUVar4;
  pointer pUVar5;
  int iVar6;
  LogMessage *pLVar7;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  Message *message2_00;
  ulong uVar8;
  UnknownFieldSet *pUVar9;
  ulong uVar10;
  Reflection *extraout_RDX;
  Reflection *extraout_RDX_00;
  ulong uVar11;
  long lVar12;
  long lVar13;
  UnknownFieldSet *pUVar14;
  long lVar15;
  LogFinisher local_61;
  LogMessage local_60;
  undefined4 extraout_var_01;
  
  if (message1 != message2) {
    (*(message1->super_MessageLite)._vptr_MessageLite[0x15])(message1);
    if (extraout_RDX != this) {
      internal::LogMessage::LogMessage
                (&local_60,LOGLEVEL_FATAL,
                 "/workspace/llm4binary/github/license_c_cmakelists/google[P]bloaty/third_party/protobuf/src/google/protobuf/generated_message_reflection.cc"
                 ,0x25c);
      pLVar7 = internal::LogMessage::operator<<
                         (&local_60,"CHECK failed: (message1->GetReflection()) == (this): ");
      pLVar7 = internal::LogMessage::operator<<(pLVar7,"First argument to Swap() (of type \"");
      iVar6 = (*(message1->super_MessageLite)._vptr_MessageLite[0x15])(message1);
      pLVar7 = internal::LogMessage::operator<<
                         (pLVar7,*(string **)(CONCAT44(extraout_var,iVar6) + 8));
      pLVar7 = internal::LogMessage::operator<<
                         (pLVar7,
                          "\") is not compatible with this reflection object (which is for type \"")
      ;
      pLVar7 = internal::LogMessage::operator<<(pLVar7,*(string **)(this->descriptor_ + 8));
      pLVar7 = internal::LogMessage::operator<<
                         (pLVar7,
                          "\").  Note that the exact same class is required; not just the same descriptor."
                         );
      internal::LogFinisher::operator=(&local_61,pLVar7);
      internal::LogMessage::~LogMessage(&local_60);
    }
    (*(message2->super_MessageLite)._vptr_MessageLite[0x15])(message2);
    if (extraout_RDX_00 != this) {
      internal::LogMessage::LogMessage
                (&local_60,LOGLEVEL_FATAL,
                 "/workspace/llm4binary/github/license_c_cmakelists/google[P]bloaty/third_party/protobuf/src/google/protobuf/generated_message_reflection.cc"
                 ,0x264);
      pLVar7 = internal::LogMessage::operator<<
                         (&local_60,"CHECK failed: (message2->GetReflection()) == (this): ");
      pLVar7 = internal::LogMessage::operator<<(pLVar7,"Second argument to Swap() (of type \"");
      iVar6 = (*(message2->super_MessageLite)._vptr_MessageLite[0x15])(message2);
      pLVar7 = internal::LogMessage::operator<<
                         (pLVar7,*(string **)(CONCAT44(extraout_var_00,iVar6) + 8));
      pLVar7 = internal::LogMessage::operator<<
                         (pLVar7,
                          "\") is not compatible with this reflection object (which is for type \"")
      ;
      pLVar7 = internal::LogMessage::operator<<(pLVar7,*(string **)(this->descriptor_ + 8));
      pLVar7 = internal::LogMessage::operator<<
                         (pLVar7,
                          "\").  Note that the exact same class is required; not just the same descriptor."
                         );
      internal::LogFinisher::operator=(&local_61,pLVar7);
      internal::LogMessage::~LogMessage(&local_60);
    }
    uVar10 = (ulong)(uint)(this->schema_).metadata_offset_;
    uVar8 = *(ulong *)((long)&(message1->super_MessageLite)._vptr_MessageLite + uVar10);
    uVar11 = uVar8;
    if ((uVar8 & 1) != 0) {
      uVar11 = *(ulong *)((uVar8 & 0xfffffffffffffffe) + 0x18);
    }
    uVar10 = *(ulong *)((long)&(message2->super_MessageLite)._vptr_MessageLite + uVar10);
    if ((uVar10 & 1) != 0) {
      uVar10 = *(ulong *)((uVar10 & 0xfffffffffffffffe) + 0x18);
    }
    if (uVar11 == uVar10) {
      uVar8 = (ulong)(uint)(this->schema_).has_bits_offset_;
      if (uVar8 != 0xffffffff) {
        lVar12 = (long)*(int *)(this->descriptor_ + 0x68);
        if (0 < lVar12) {
          lVar15 = *(long *)(this->descriptor_ + 0x28);
          lVar13 = 0;
          iVar6 = 0;
          do {
            if (*(int *)(lVar15 + 0x3c + lVar13) != 3) {
              iVar6 = iVar6 + (uint)(*(long *)(lVar15 + 0x58 + lVar13) == 0);
            }
            lVar13 = lVar13 + 0x98;
          } while (lVar12 * 0x98 - lVar13 != 0);
          if (0 < iVar6) {
            uVar11 = 0;
            do {
              uVar1 = *(undefined4 *)
                       ((long)&(message1->super_MessageLite)._vptr_MessageLite + uVar11 * 4 + uVar8)
              ;
              *(undefined4 *)
               ((long)&(message1->super_MessageLite)._vptr_MessageLite + uVar11 * 4 + uVar8) =
                   *(undefined4 *)
                    ((long)&(message2->super_MessageLite)._vptr_MessageLite + uVar11 * 4 + uVar8);
              *(undefined4 *)
               ((long)&(message2->super_MessageLite)._vptr_MessageLite + uVar11 * 4 + uVar8) = uVar1
              ;
              uVar11 = uVar11 + 1;
            } while (iVar6 + 0x1fU >> 5 != uVar11);
          }
        }
      }
      iVar6 = this->last_non_weak_field_index_;
      if (-1 < iVar6) {
        lVar12 = -1;
        lVar15 = 0;
        do {
          if (*(long *)(*(long *)(this->descriptor_ + 0x28) + 0x58 + lVar15) == 0) {
            SwapField(this,message1,message2,
                      (FieldDescriptor *)(*(long *)(this->descriptor_ + 0x28) + lVar15));
            iVar6 = this->last_non_weak_field_index_;
          }
          lVar12 = lVar12 + 1;
          lVar15 = lVar15 + 0x98;
        } while (lVar12 < iVar6);
      }
      iVar6 = *(int *)(this->descriptor_ + 0x6c);
      if (0 < (long)iVar6) {
        lVar12 = 0;
        do {
          SwapOneofField(this,message1,message2,
                         (OneofDescriptor *)(*(long *)(this->descriptor_ + 0x30) + lVar12));
          lVar12 = lVar12 + 0x30;
        } while ((long)iVar6 * 0x30 != lVar12);
      }
      uVar8 = (ulong)(uint)(this->schema_).extensions_offset_;
      if (uVar8 != 0xffffffff) {
        internal::ExtensionSet::Swap
                  ((ExtensionSet *)((long)&(message1->super_MessageLite)._vptr_MessageLite + uVar8),
                   (ExtensionSet *)((long)&(message2->super_MessageLite)._vptr_MessageLite + uVar8))
        ;
      }
      uVar11 = (ulong)(uint)(this->schema_).metadata_offset_;
      uVar8 = *(ulong *)((long)&(message1->super_MessageLite)._vptr_MessageLite + uVar11);
      if ((uVar8 & 1) == 0) {
        pUVar14 = internal::
                  InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
                  ::mutable_unknown_fields_slow
                            ((InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
                              *)((long)&(message1->super_MessageLite)._vptr_MessageLite + uVar11));
        uVar11 = (ulong)(uint)(this->schema_).metadata_offset_;
      }
      else {
        pUVar14 = (UnknownFieldSet *)(uVar8 & 0xfffffffffffffffe);
      }
      uVar8 = *(ulong *)((long)&(message2->super_MessageLite)._vptr_MessageLite + uVar11);
      if ((uVar8 & 1) == 0) {
        pUVar9 = internal::
                 InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
                 ::mutable_unknown_fields_slow
                           ((InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
                             *)((long)&(message2->super_MessageLite)._vptr_MessageLite + uVar11));
      }
      else {
        pUVar9 = (UnknownFieldSet *)(uVar8 & 0xfffffffffffffffe);
      }
      pUVar2 = (pUVar14->fields_).
               super__Vector_base<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage;
      pUVar3 = (pUVar9->fields_).
               super__Vector_base<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      pUVar4 = (pUVar14->fields_).
               super__Vector_base<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_>
               ._M_impl.super__Vector_impl_data._M_start;
      pUVar5 = (pUVar14->fields_).
               super__Vector_base<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      (pUVar14->fields_).
      super__Vector_base<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_>
      ._M_impl.super__Vector_impl_data._M_start =
           (pUVar9->fields_).
           super__Vector_base<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_>
           ._M_impl.super__Vector_impl_data._M_start;
      (pUVar14->fields_).
      super__Vector_base<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_>
      ._M_impl.super__Vector_impl_data._M_finish = pUVar3;
      (pUVar14->fields_).
      super__Vector_base<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage =
           (pUVar9->fields_).
           super__Vector_base<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage;
      (pUVar9->fields_).
      super__Vector_base<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_>
      ._M_impl.super__Vector_impl_data._M_start = pUVar4;
      (pUVar9->fields_).
      super__Vector_base<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_>
      ._M_impl.super__Vector_impl_data._M_finish = pUVar5;
      (pUVar9->fields_).
      super__Vector_base<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = pUVar2;
    }
    else {
      if ((uVar8 & 1) != 0) {
        uVar8 = *(ulong *)((uVar8 & 0xfffffffffffffffe) + 0x18);
      }
      iVar6 = (*(message1->super_MessageLite)._vptr_MessageLite[4])(message1,uVar8);
      message2_00 = (Message *)CONCAT44(extraout_var_01,iVar6);
      (*(message2_00->super_MessageLite)._vptr_MessageLite[0x11])(message2_00,message2);
      (*(message2->super_MessageLite)._vptr_MessageLite[0x10])(message2,message1);
      Swap(this,message1,message2_00);
      uVar8 = *(ulong *)((long)&(message1->super_MessageLite)._vptr_MessageLite +
                        (ulong)(uint)(this->schema_).metadata_offset_);
      if ((uVar8 & 1) != 0) {
        uVar8 = *(ulong *)((uVar8 & 0xfffffffffffffffe) + 0x18);
      }
      if (uVar8 == 0) {
        (*(message2_00->super_MessageLite)._vptr_MessageLite[1])(message2_00);
      }
    }
  }
  return;
}

Assistant:

void Reflection::Swap(Message* message1, Message* message2) const {
  if (message1 == message2) return;

  // TODO(kenton):  Other Reflection methods should probably check this too.
  GOOGLE_CHECK_EQ(message1->GetReflection(), this)
      << "First argument to Swap() (of type \""
      << message1->GetDescriptor()->full_name()
      << "\") is not compatible with this reflection object (which is for type "
         "\""
      << descriptor_->full_name()
      << "\").  Note that the exact same class is required; not just the same "
         "descriptor.";
  GOOGLE_CHECK_EQ(message2->GetReflection(), this)
      << "Second argument to Swap() (of type \""
      << message2->GetDescriptor()->full_name()
      << "\") is not compatible with this reflection object (which is for type "
         "\""
      << descriptor_->full_name()
      << "\").  Note that the exact same class is required; not just the same "
         "descriptor.";

  // Check that both messages are in the same arena (or both on the heap). We
  // need to copy all data if not, due to ownership semantics.
  if (GetArena(message1) != GetArena(message2)) {
    // Slow copy path.
    // Use our arena as temp space, if available.
    Message* temp = message1->New(GetArena(message1));
    temp->MergeFrom(*message2);
    message2->CopyFrom(*message1);
    Swap(message1, temp);
    if (GetArena(message1) == nullptr) {
      delete temp;
    }
    return;
  }

  if (schema_.HasHasbits()) {
    uint32* has_bits1 = MutableHasBits(message1);
    uint32* has_bits2 = MutableHasBits(message2);

    int fields_with_has_bits = 0;
    for (int i = 0; i < descriptor_->field_count(); i++) {
      const FieldDescriptor* field = descriptor_->field(i);
      if (field->is_repeated() || field->containing_oneof()) {
        continue;
      }
      fields_with_has_bits++;
    }

    int has_bits_size = (fields_with_has_bits + 31) / 32;

    for (int i = 0; i < has_bits_size; i++) {
      std::swap(has_bits1[i], has_bits2[i]);
    }
  }

  for (int i = 0; i <= last_non_weak_field_index_; i++) {
    const FieldDescriptor* field = descriptor_->field(i);
    if (field->containing_oneof()) continue;
    SwapField(message1, message2, field);
  }
  const int oneof_decl_count = descriptor_->oneof_decl_count();
  for (int i = 0; i < oneof_decl_count; i++) {
    SwapOneofField(message1, message2, descriptor_->oneof_decl(i));
  }

  if (schema_.HasExtensionSet()) {
    MutableExtensionSet(message1)->Swap(MutableExtensionSet(message2));
  }

  MutableUnknownFields(message1)->Swap(MutableUnknownFields(message2));
}